

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O0

vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *
vkt::pipeline::anon_unknown_0::genSizeCombinations
          (vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
           *__return_storage_ptr__,IVec4 *baselineSize,deUint32 sizeMask,
          VkImageViewType imageViewType)

{
  bool bVar1;
  reference puVar2;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar3;
  Vector<bool,_4> local_b4;
  Vector<int,_4> local_b0;
  value_type local_a0;
  _Self local_90;
  _Self local_88;
  const_iterator it;
  uint local_70 [5];
  uint local_5c;
  undefined1 local_58 [4];
  deUint32 i;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> masks;
  VkImageViewType imageViewType_local;
  deUint32 sizeMask_local;
  IVec4 *baselineSize_local;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *sizes;
  
  masks._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (__return_storage_ptr__);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_58);
  for (local_5c = 0; local_5c < 0x10; local_5c = local_5c + 1) {
    bVar1 = isCube(imageViewType);
    if ((bVar1) && ((local_5c & 3) != 0)) {
      local_5c = local_5c | 3;
    }
    local_70[0] = local_5c & sizeMask;
    pVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       local_58,local_70);
    it._M_node = (_Base_ptr)pVar3.first._M_node;
  }
  local_88._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  local_58);
  while( true ) {
    local_90._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                   ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    local_58);
    bVar1 = std::operator!=(&local_88,&local_90);
    if (!bVar1) break;
    tcu::Vector<int,_4>::Vector(&local_b0,-1);
    puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&local_88);
    bvecFromMask((anon_unknown_0 *)&local_b4,*puVar2);
    tcu::select<int,4>((tcu *)&local_a0,&local_b0,baselineSize,&local_b4);
    std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::push_back
              (__return_storage_ptr__,&local_a0);
    std::_Rb_tree_const_iterator<unsigned_int>::operator++(&local_88);
  }
  masks._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_58);
  if ((masks._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<IVec4> genSizeCombinations (const IVec4& baselineSize, const deUint32 sizeMask, const VkImageViewType imageViewType)
{
	vector<IVec4>		sizes;
	std::set<deUint32>	masks;

	for (deUint32 i = 0; i < (1u << 4); ++i)
	{
		// Cube images have square faces
		if (isCube(imageViewType) && ((i & MASK_WH) != 0))
			i |= MASK_WH;

		masks.insert(i & sizeMask);
	}

	for (std::set<deUint32>::const_iterator it = masks.begin(); it != masks.end(); ++it)
		sizes.push_back(tcu::select(IVec4(MAX_SIZE), baselineSize, bvecFromMask(*it)));

	return sizes;
}